

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O0

JavascriptString *
Js::JavascriptNumber::ToLocaleStringNanOrInfinite(double value,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  UINT cchUseLength;
  undefined4 *puVar4;
  JavascriptString *str;
  BSTR bstr;
  ScriptContext *scriptContext_local;
  double value_local;
  
  bVar2 = NumberUtilities::IsFinite(value);
  if (bVar2) {
    value_local = 0.0;
  }
  else {
    BVar3 = IsNan(value);
    if (BVar3 == 0) {
      bVar2 = IsPosInf(value);
      if (bVar2) {
        str = (JavascriptString *)BstrGetResourceString(6000);
      }
      else {
        bVar2 = IsNegInf(value);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                      ,0x428,"(IsNegInf(value))","bad handling of infinite number");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        str = (JavascriptString *)BstrGetResourceString(0x1771);
      }
      if (str == (JavascriptString *)0x0) {
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
      }
      cchUseLength = SysStringLen((BSTR)str);
      value_local = (double)JavascriptString::NewCopyBuffer
                                      ((char16 *)str,cchUseLength,scriptContext);
      SysFreeString((BSTR)str);
    }
    else {
      value_local = (double)ToStringNan(scriptContext);
    }
  }
  return (JavascriptString *)value_local;
}

Assistant:

JavascriptString* JavascriptNumber::ToLocaleStringNanOrInfinite(double value, ScriptContext* scriptContext)
    {
        if (!NumberUtilities::IsFinite(value))
        {
            if (IsNan(value))
            {
                return ToStringNan(scriptContext);
            }

            BSTR bstr = nullptr;
            if (IsPosInf(value))
            {
                bstr = BstrGetResourceString(IDS_INFINITY);
            }
            else
            {
                AssertMsg(IsNegInf(value), "bad handling of infinite number");
                bstr = BstrGetResourceString(IDS_MINUSINFINITY);
            }

            if (bstr == nullptr)
            {
                Js::JavascriptError::ThrowTypeError(scriptContext, VBSERR_InternalError);
            }
            JavascriptString* str = JavascriptString::NewCopyBuffer(bstr, SysStringLen(bstr), scriptContext);
            SysFreeString(bstr);
            return str;
        }
        return nullptr;
    }